

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O2

void __thiscall UnitTest::UnitTester::runTestInt(UnitTester *this,TestFunction fun,char *name)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  
  if ((_DAT_00107170 != (char *)0x0) && (iVar1 = strcmp(name,_DAT_00107170), iVar1 != 0)) {
    return;
  }
  _global_unit_test_object_ = 1;
  _DAT_00107164 = 0x3f800000;
  _DAT_00107168 = 0x3ff0000000000000;
  (*fun)();
  if (DAT_00107159 == '\x01') {
    if (global_unit_test_object_ == '\0') {
      poVar2 = std::operator<<((ostream *)&std::cout,"XFAIL: ");
      poVar2 = std::operator<<(poVar2,name);
      std::endl<char,std::char_traits<char>>(poVar2);
      return;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"unexpected PASS: ");
    poVar2 = std::operator<<(poVar2,name);
    poVar2 = std::operator<<(poVar2,
                             "\n    This test should have failed but didn\'t. Check the code!");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    if (global_unit_test_object_ != '\0') {
      poVar2 = operator<<((ostream *)&std::cout,(Type *)&AnsiColor::green);
      poVar2 = std::operator<<(poVar2," PASS: ");
      operator<<(poVar2,(Type *)&AnsiColor::normal);
      std::operator<<((ostream *)&std::cout,name);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      this->passedTests = this->passedTests + 1;
      return;
    }
    pcVar3 = _unittest_fail();
    std::operator<<((ostream *)&std::cout,pcVar3);
    if (this->vim_lines == false) {
      std::operator<<((ostream *)&std::cout,anon_var_dwarf_3b30);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,name);
    std::endl<char,std::char_traits<char>>(poVar2);
    if (this->vim_lines == true) {
      std::operator<<((ostream *)&std::cout,'\n');
    }
  }
  this->failedTests = this->failedTests + 1;
  return;
}

Assistant:

void UnitTester::runTestInt(TestFunction fun, const char *name) {  // {{{1
  if (global_unit_test_object_.only_name &&
      0 != std::strcmp(name, global_unit_test_object_.only_name)) {
    return;
  }
  global_unit_test_object_.status = true;
  global_unit_test_object_.expect_failure = false;
  try {
    setFuzzyness<float>(1);
    setFuzzyness<double>(1);
    fun();
  }
  catch (UnitTestFailure) {
  }
  catch (std::exception &e) {
    std::cout << _unittest_fail() << "┍ " << name
              << " threw an unexpected exception:\n";
    std::cout << _unittest_fail() << "│ " << e.what() << '\n';
    global_unit_test_object_.status = false;
  }
  catch (...) {
    std::cout << _unittest_fail() << "┍ " << name
              << " threw an unexpected exception, of unknown type\n";
    global_unit_test_object_.status = false;
  }
  if (global_unit_test_object_.expect_failure) {
    if (!global_unit_test_object_.status) {
      std::cout << "XFAIL: " << name << std::endl;
    } else {
      std::cout
          << "unexpected PASS: " << name
          << "\n    This test should have failed but didn't. Check the code!"
          << std::endl;
      ++failedTests;
    }
  } else {
    if (!global_unit_test_object_.status) {
      std::cout << _unittest_fail();
      if (!vim_lines) {
        std::cout << "┕ ";
      }
      std::cout << name << std::endl;
      if (vim_lines) {
        std::cout << '\n';
      }
      ++failedTests;
    } else {
      UnitTest::printPass();
      std::cout << name;
      std::cout << std::endl;
      ++passedTests;
    }
  }
}